

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O2

int omon_adj(monst *mon,obj *obj,boolean mon_notices)

{
  char cVar1;
  short sVar2;
  permonst *ppVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  ppVar3 = mon->data;
  uVar6 = (uint)ppVar3->msize;
  uVar4 = *(uint *)&mon->field_0x60;
  if ((uVar4 >> 0x13 & 1) == 0) {
    uVar6 = ppVar3->msize - 2;
  }
  else if (mon_notices != '\0') {
    uVar4 = uVar4 & 0xfff7ffff;
    *(uint *)&mon->field_0x60 = uVar4;
  }
  if (((((uVar4 >> 0x12 & 1) == 0) || (ppVar3->mmove == '\0')) &&
      (uVar6 = uVar6 + 4, mon_notices != '\0')) &&
     ((ppVar3->mmove != '\0' && (uVar4 = mt_random(), uVar4 % 10 == 0)))) {
    mon->field_0x62 = mon->field_0x62 | 4;
    mon->mfrozen = '\0';
  }
  sVar2 = obj->otyp;
  if (sVar2 == 0x214) {
    uVar4 = uVar6 + 6;
  }
  else {
    uVar4 = uVar6;
    if (sVar2 == 0x216) {
      uVar4 = uVar6 + 2;
      if (uball == obj) {
        uVar4 = uVar6;
      }
    }
    else {
      cVar1 = obj->oclass;
      if (((cVar1 == '\x02') || (cVar1 == '\r')) ||
         ((cVar1 == '\x06' && (objects[sVar2].oc_subtyp != '\0')))) {
        iVar5 = hitval(obj,mon);
        uVar4 = uVar6 + iVar5;
      }
    }
  }
  return uVar4;
}

Assistant:

int omon_adj(struct monst *mon, struct obj *obj, boolean mon_notices)
{
	int tmp = 0;

	/* size of target affects the chance of hitting */
	tmp += (mon->data->msize - MZ_MEDIUM);		/* -2..+5 */
	/* sleeping target is more likely to be hit */
	if (mon->msleeping) {
	    tmp += 2;
	    if (mon_notices) mon->msleeping = 0;
	}
	/* ditto for immobilized target */
	if (!mon->mcanmove || !mon->data->mmove) {
	    tmp += 4;
	    if (mon_notices && mon->data->mmove && !rn2(10)) {
		mon->mcanmove = 1;
		mon->mfrozen = 0;
	    }
	}
	/* some objects are more likely to hit than others */
	switch (obj->otyp) {
	case HEAVY_IRON_BALL:
	    if (obj != uball) tmp += 2;
	    break;
	case BOULDER:
	    tmp += 6;
	    break;
	default:
	    if (obj->oclass == WEAPON_CLASS || is_weptool(obj) ||
		    obj->oclass == GEM_CLASS)
		tmp += hitval(obj, mon);
	    break;
	}
	return tmp;
}